

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST_Parser.cpp
# Opt level: O2

shared_ptr<nigel::AstCondition> __thiscall
nigel::AST_Parser::splitMostRightExpr
          (AST_Parser *this,shared_ptr<nigel::AstExpr> *currLVal,
          shared_ptr<nigel::AstCombinationCondition> *cExpr,int priority)

{
  int iVar1;
  AST_Parser *pAVar2;
  mapped_type *pmVar3;
  undefined4 in_register_0000000c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_R8D;
  shared_ptr<nigel::AstCondition> sVar4;
  shared_ptr<nigel::AstCombinationCondition> clTerm;
  undefined1 local_70 [24];
  __shared_ptr<nigel::AstCombinationCondition,_(__gnu_cxx::_Lock_policy)2> local_58;
  shared_ptr<nigel::AstExpr> *local_40;
  AST_Parser *local_38;
  
  local_70._16_8_ = CONCAT44(in_register_0000000c,priority);
  local_58._M_ptr = (element_type *)0x0;
  local_58._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_40 = currLVal;
  local_38 = this;
  while ((((cExpr->super___shared_ptr<nigel::AstCombinationCondition,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr)->super_AstCondition).super_AstExpr.type == combinationCondition) {
    AstExpr::as<nigel::AstCombinationCondition>((AstExpr *)local_70);
    pmVar3 = std::
             map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
             ::operator[]((map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                           *)(currLVal + 2),(key_type *)(local_70._0_8_ + 0x50));
    iVar1 = *pmVar3;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
    if (in_R8D <= iVar1) break;
    AstExpr::as<nigel::AstCombinationCondition>((AstExpr *)local_70);
    std::__shared_ptr<nigel::AstCombinationCondition,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_58,
               (__shared_ptr<nigel::AstCombinationCondition,_(__gnu_cxx::_Lock_policy)2> *)local_70)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
    AstExpr::as<nigel::AstCombinationCondition>((AstExpr *)local_70);
    std::__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2> *)cExpr,
               (__shared_ptr<nigel::AstCondition,_(__gnu_cxx::_Lock_policy)2> *)
               (local_70._0_8_ + 0x40));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
  }
  if (local_58._M_ptr == (element_type *)0x0) {
    std::__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2> *)(local_40 + 0xb),
               (__shared_ptr<nigel::AstCombinationCondition,_(__gnu_cxx::_Lock_policy)2> *)
               local_70._16_8_);
  }
  else {
    std::__shared_ptr<nigel::AstCondition,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<nigel::AstCondition,(__gnu_cxx::_Lock_policy)2> *)
               &(local_58._M_ptr)->rVal,
               (__shared_ptr<nigel::AstCombinationCondition,_(__gnu_cxx::_Lock_policy)2> *)
               local_70._16_8_);
  }
  pAVar2 = local_38;
  AstExpr::as<nigel::AstCondition>((AstExpr *)local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  sVar4.super___shared_ptr<nigel::AstCondition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<nigel::AstCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pAVar2;
  return (shared_ptr<nigel::AstCondition>)
         sVar4.super___shared_ptr<nigel::AstCondition,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<AstCondition> AST_Parser::splitMostRightExpr( std::shared_ptr<AstExpr> currLVal, std::shared_ptr<AstCombinationCondition> cExpr, int priority )
	{
		//Check if lValue is a term
		std::shared_ptr<AstCombinationCondition> clTerm = nullptr;
		while( currLVal->type == AstExpr::Type::combinationCondition && opPriority[currLVal->as<AstCombinationCondition>()->op] < priority )
		{//Check if lTerm has to be splitted up
			clTerm = currLVal->as<AstCombinationCondition>();
			currLVal = currLVal->as<AstCombinationCondition>()->rVal;
		}

		//Test for lTerm
		if( clTerm != nullptr )
		{//Min. 1 term was splitted up
			clTerm->rVal = cExpr;
			return currLVal->as<AstCondition>();
		}
		else
		{//LValue is a atomic astExpr
			lValue = cExpr;//Set as lValue
			return currLVal->as<AstCondition>();
		}
	}